

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void Assimp::OpenGEX::getRefNames
               (DDLNode *node,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  char *pcVar1;
  Reference *pRVar2;
  ulong uVar3;
  allocator local_51;
  undefined1 local_50 [8];
  string name;
  Name *currentName;
  size_t i;
  Reference *ref;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  DDLNode *node_local;
  
  if (node == (DDLNode *)0x0) {
    __assert_fail("nullptr != node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x1f2,"void Assimp::OpenGEX::getRefNames(DDLNode *, std::vector<std::string> &)")
    ;
  }
  pRVar2 = ODDLParser::DDLNode::getReferences(node);
  if (pRVar2 != (Reference *)0x0) {
    for (currentName = (Name *)0x0; currentName < (Name *)pRVar2->m_numRefs;
        currentName = (Name *)((long)&currentName->m_type + 1)) {
      name.field_2._8_8_ = pRVar2->m_referencedName[(long)currentName];
      if (((Name *)name.field_2._8_8_ != (Name *)0x0) &&
         (((Name *)name.field_2._8_8_)->m_id != (Text *)0x0)) {
        pcVar1 = ((Name *)name.field_2._8_8_)->m_id->m_buffer;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_50,pcVar1,&local_51);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(names,(value_type *)local_50);
        }
        std::__cxx11::string::~string((string *)local_50);
      }
    }
  }
  return;
}

Assistant:

static void getRefNames( DDLNode *node, std::vector<std::string> &names ) {
    ai_assert( nullptr != node );

    Reference *ref = node->getReferences();
    if( nullptr != ref ) {
        for( size_t i = 0; i < ref->m_numRefs; i++ )  {
            Name *currentName( ref->m_referencedName[ i ] );
            if( nullptr != currentName && nullptr != currentName->m_id ) {
#ifdef ASSIMP_USE_HUNTER
                const std::string name( currentName->m_id->m_text.m_buffer );
#else
                const std::string name( currentName->m_id->m_buffer );
#endif
                if( !name.empty() ) {
                    names.push_back( name );
                }
            }
        }
    }
}